

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

void UnknownChunk(StreamReaderLE *param_1,SIBChunk *chunk)

{
  Logger *this;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this_00;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  SIBChunk *pSStack_18;
  char temp [5];
  SIBChunk *chunk_local;
  StreamReaderLE *param_0_local;
  
  local_1d = *(char *)((long)&chunk->Tag + 3);
  local_1c = *(char *)((long)&chunk->Tag + 2);
  local_1b = *(char *)((long)&chunk->Tag + 1);
  local_1a = (char)chunk->Tag;
  local_19 = '\0';
  pSStack_18 = chunk;
  this = Assimp::DefaultLogger::get();
  Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter(&local_1b8);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
           operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1b8
                     ,(char (*) [24])"SIB: Skipping unknown \'");
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
           operator_(pbVar1,(char (*) [5])&local_1d);
  this_00 = (basic_formatter *)
            Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            operator_(pbVar1,(char (*) [9])"\' chunk.");
  Assimp::Formatter::basic_formatter::operator_cast_to_string(&local_40,this_00);
  Assimp::Logger::warn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  ~basic_formatter(&local_1b8);
  return;
}

Assistant:

static void UnknownChunk(StreamReaderLE* /*stream*/, const SIBChunk& chunk)
{
    char temp[5] = {
        static_cast<char>(( chunk.Tag>>24 ) & 0xff),
        static_cast<char>(( chunk.Tag>>16 ) & 0xff),
        static_cast<char>(( chunk.Tag>>8 ) & 0xff),
        static_cast<char>(chunk.Tag & 0xff), '\0'
    };

    ASSIMP_LOG_WARN((Formatter::format(), "SIB: Skipping unknown '",temp,"' chunk."));
}